

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_add(Curl_hash *h,void *key,size_t key_len,void *p)

{
  Curl_llist_element *e;
  Curl_llist *pCVar1;
  void *ne;
  size_t sVar2;
  long lVar3;
  Curl_llist *pCVar4;
  long lVar5;
  
  pCVar1 = h->table;
  if (pCVar1 == (Curl_llist *)0x0) {
    pCVar1 = (Curl_llist *)(*Curl_cmalloc)((long)h->slots << 5);
    h->table = pCVar1;
    if (pCVar1 == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
    lVar3 = 0;
    lVar5 = 0;
    while( true ) {
      sVar2 = (size_t)h->slots;
      pCVar1 = h->table;
      if ((long)sVar2 <= lVar5) break;
      Curl_llist_init((Curl_llist *)((long)&pCVar1->head + lVar3),hash_element_dtor);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x20;
    }
  }
  else {
    sVar2 = (size_t)h->slots;
  }
  sVar2 = (*h->hash_func)(key,key_len,sVar2);
  pCVar1 = pCVar1 + sVar2;
  pCVar4 = pCVar1;
  do {
    e = pCVar4->head;
    if (e == (Curl_llist_element *)0x0) {
LAB_00132222:
      ne = (*Curl_cmalloc)(key_len + 0x30);
      if (ne == (void *)0x0) {
        return (void *)0x0;
      }
      memcpy((void *)((long)ne + 0x28),key,key_len);
      *(size_t *)((long)ne + 0x20) = key_len;
      *(void **)((long)ne + 0x18) = p;
      Curl_llist_insert_next(pCVar1,pCVar1->tail,ne,(Curl_llist_element *)ne);
      h->size = h->size + 1;
      return p;
    }
    sVar2 = (*h->comp_func)((void *)((long)e->ptr + 0x28),*(size_t *)((long)e->ptr + 0x20),key,
                            key_len);
    if (sVar2 != 0) {
      Curl_llist_remove(pCVar1,e,h);
      h->size = h->size - 1;
      goto LAB_00132222;
    }
    pCVar4 = (Curl_llist *)&e->next;
  } while( true );
}

Assistant:

void *
Curl_hash_add(struct Curl_hash *h, void *key, size_t key_len, void *p)
{
  struct Curl_hash_element  *he;
  struct Curl_llist_element *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  if(!h->table) {
    int i;
    h->table = malloc(h->slots * sizeof(struct Curl_llist));
    if(!h->table)
      return NULL; /* OOM */
    for(i = 0; i < h->slots; ++i)
      Curl_llist_init(&h->table[i], hash_element_dtor);
  }

  l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = (struct Curl_hash_element *) le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p);
  if(he) {
    Curl_llist_insert_next(l, l->tail, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}